

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void * operator_new(size_t size,nothrow_t *param_2)

{
  void *p;
  
  p = debug_cpp_alloc(size,-0x145237f,true);
  tcmalloc::InvokeNewHook(p,size);
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_new_nothrow(size_t size, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  void* ptr = debug_cpp_alloc(size, MallocBlock::kNewType, true);
  tcmalloc::InvokeNewHook(ptr, size);
  return ptr;
}